

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.h
# Opt level: O0

bool Memory::HeapBlockList::
     Contains<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>>
               (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *block,
               SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *list,
               SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *tail)

{
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *local_30;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *heapBlock;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *tail_local;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *list_local;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *block_local;
  
  local_30 = list;
  while( true ) {
    if (local_30 == tail) {
      return false;
    }
    if (local_30 == block) break;
    local_30 = SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>::GetNextBlock(local_30);
  }
  return true;
}

Assistant:

static bool Contains(TBlockType * block, TBlockType * list, TBlockType * tail = nullptr)
    {
        TBlockType * heapBlock = list;
        while (heapBlock != tail)
        {
            if (heapBlock == block)
            {
                return true;
            }
            heapBlock = heapBlock->GetNextBlock();
        }
        return false;
    }